

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O1

amqp_rpc_reply_t *
amqp_channel_close(amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,
                  amqp_channel_t channel,int code)

{
  int iVar1;
  amqp_method_number_t replies [2];
  char codestr [13];
  amqp_channel_close_t req;
  amqp_method_number_t local_60 [2];
  char local_55 [13];
  undefined2 local_48 [4];
  long local_40;
  char *local_38;
  undefined4 local_30;
  
  local_60[0] = 0x140029;
  local_60[1] = 0;
  local_48[0] = (undefined2)code;
  local_38 = local_55;
  iVar1 = sprintf(local_38,"%d",(ulong)(uint)code);
  local_40 = (long)iVar1;
  local_30 = 0;
  amqp_simple_rpc(__return_storage_ptr__,state,channel,0x140028,local_60,local_48);
  return __return_storage_ptr__;
}

Assistant:

amqp_rpc_reply_t amqp_channel_close(amqp_connection_state_t state,
                                    amqp_channel_t channel,
                                    int code)
{
  char codestr[13];
  amqp_method_number_t replies[2] = { AMQP_CHANNEL_CLOSE_OK_METHOD, 0};
  amqp_channel_close_t req;

  req.reply_code = code;
  req.reply_text.bytes = codestr;
  req.reply_text.len = sprintf(codestr, "%d", code);
  req.class_id = 0;
  req.method_id = 0;

  return amqp_simple_rpc(state, channel, AMQP_CHANNEL_CLOSE_METHOD,
                         replies, &req);
}